

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSat3.c
# Opt level: O3

int Gia_ManSat3CallOne(Gia_Man_t *p,int iOutput)

{
  int iVar1;
  int status;
  int iVar2;
  sat_solver3 *s;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  s = Gia_ManSat3Create(p);
  if (s == (sat_solver3 *)0x0) {
    iVar1 = 0;
    status = -1;
  }
  else {
    status = sat_solver3_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    iVar1 = (int)(s->stats).conflicts;
    sat_solver3_delete(s);
  }
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Gia_ManSat3Report(iOutput,status,lVar4 + lVar3);
  return iVar1;
}

Assistant:

int Gia_ManSat3CallOne( Gia_Man_t * p, int iOutput )
{
    abctime clk = Abc_Clock();
    sat_solver3 * pSat;
    int status, Cost = 0;

    pSat = Gia_ManSat3Create( p );
    if ( pSat )
    {
        status = sat_solver3_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        Cost = (unsigned)pSat->stats.conflicts;
        sat_solver3_delete( pSat );
    }
    else 
        status = l_False;

    Gia_ManSat3Report( iOutput, status, Abc_Clock() - clk );
    return Cost;
}